

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# background_thread.c
# Opt level: O0

int background_thread_create_signals_masked
              (pthread_t *thread,pthread_attr_t *attr,_func_void_ptr_void_ptr *start_routine,
              void *arg)

{
  uint uVar1;
  int restore_err;
  int create_err;
  int mask_err;
  sigset_t oldset;
  sigset_t set;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  uint in_stack_fffffffffffffed0;
  pthread_attr_t *in_stack_fffffffffffffed8;
  pthread_t *in_stack_fffffffffffffee0;
  uint local_4;
  
  sigfillset((sigset_t *)&stack0xffffffffffffff58);
  local_4 = pthread_sigmask(2,(__sigset_t *)&stack0xffffffffffffff58,
                            (__sigset_t *)&stack0xfffffffffffffed8);
  if (local_4 == 0) {
    local_4 = pthread_create_wrapper
                        (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                         (_func_void_ptr_void_ptr *)(ulong)in_stack_fffffffffffffed0,
                         (void *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    uVar1 = pthread_sigmask(2,(__sigset_t *)&stack0xfffffffffffffed8,(__sigset_t *)0x0);
    if ((uVar1 != 0) &&
       (malloc_printf("<jemalloc>: background thread creation failed (%d), and signal mask restoration failed (%d)\n"
                      ,(ulong)local_4,(ulong)uVar1), (opt_abort & 1U) != 0)) {
      abort();
    }
  }
  return local_4;
}

Assistant:

static int
background_thread_create_signals_masked(pthread_t *thread,
    const pthread_attr_t *attr, void *(*start_routine)(void *), void *arg) {
	/*
	 * Mask signals during thread creation so that the thread inherits
	 * an empty signal set.
	 */
	sigset_t set;
	sigfillset(&set);
	sigset_t oldset;
	int mask_err = pthread_sigmask(SIG_SETMASK, &set, &oldset);
	if (mask_err != 0) {
		return mask_err;
	}
	int create_err = pthread_create_wrapper(thread, attr, start_routine,
	    arg);
	/*
	 * Restore the signal mask.  Failure to restore the signal mask here
	 * changes program behavior.
	 */
	int restore_err = pthread_sigmask(SIG_SETMASK, &oldset, NULL);
	if (restore_err != 0) {
		malloc_printf("<jemalloc>: background thread creation "
		    "failed (%d), and signal mask restoration failed "
		    "(%d)\n", create_err, restore_err);
		if (opt_abort) {
			abort();
		}
	}
	return create_err;
}